

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

void __thiscall Assimp::STEP::DB::~DB(DB *this)

{
  LazyObject *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Rb_tree_node_base *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  for (p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = (LazyObject *)p_Var2[1]._M_parent;
    if (this_00 != (LazyObject *)0x0) {
      LazyObject::~LazyObject(this_00);
    }
    operator_delete(this_00,0x28);
  }
  pcVar1 = (this->splitter).mCur._M_dataplus._M_p;
  paVar3 = &(this->splitter).mCur.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  this_01 = (this->reader).
            super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::
  _Rb_tree<const_char_*,_const_char_*,_std::_Identity<const_char_*>,_std::less<const_char_*>,_std::allocator<const_char_*>_>
  ::~_Rb_tree(&(this->inv_whitelist)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->refs)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
  ::~_Rb_tree(&(this->objects_bytype)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  pcVar1 = (this->header).fileSchema._M_dataplus._M_p;
  paVar3 = &(this->header).fileSchema.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->header).app._M_dataplus._M_p;
  paVar3 = &(this->header).app.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->header).timestamp._M_dataplus._M_p;
  paVar3 = &(this->header).timestamp.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar3) {
    return;
  }
  operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  return;
}

Assistant:

~DB() {
            for(ObjectMap::value_type& o : objects) {
                delete o.second;
            }
        }